

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O3

int hostkey_method_ssh_rsa_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  RSA *rsactx;
  int iVar1;
  long lVar2;
  EVP_MD_CTX *ctx;
  uchar hash [20];
  EVP_MD_CTX *local_58;
  size_t *local_50;
  uchar local_48 [24];
  
  rsactx = (RSA *)*abstract;
  local_50 = signature_len;
  _libssh2_sha1_init((EVP_MD_CTX **)&local_58);
  if (0 < veccount) {
    lVar2 = 0;
    do {
      EVP_DigestUpdate(local_58,*(void **)((long)&datavec->iov_base + lVar2),
                       *(size_t *)((long)&datavec->iov_len + lVar2));
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)veccount << 4 != lVar2);
  }
  EVP_DigestFinal(local_58,local_48,(uint *)0x0);
  EVP_MD_CTX_free(local_58);
  iVar1 = _libssh2_rsa_sha1_sign(session,rsactx,local_48,0x14,signature,local_50);
  return -(uint)(iVar1 != 0);
}

Assistant:

static int
hostkey_method_ssh_rsa_signv(LIBSSH2_SESSION * session,
                             unsigned char **signature,
                             size_t *signature_len,
                             int veccount,
                             const struct iovec datavec[],
                             void **abstract)
{
    libssh2_rsa_ctx *rsactx = (libssh2_rsa_ctx *) (*abstract);

#ifdef _libssh2_rsa_sha1_signv
    return _libssh2_rsa_sha1_signv(session, signature, signature_len,
                                   veccount, datavec, rsactx);
#else
    int ret;
    int i;
    unsigned char hash[SHA_DIGEST_LENGTH];
    libssh2_sha1_ctx ctx;

    (void)libssh2_sha1_init(&ctx);
    for(i = 0; i < veccount; i++) {
        libssh2_sha1_update(ctx, datavec[i].iov_base, datavec[i].iov_len);
    }
    libssh2_sha1_final(ctx, hash);

    ret = _libssh2_rsa_sha1_sign(session, rsactx, hash, SHA_DIGEST_LENGTH,
                                 signature, signature_len);
    if(ret) {
        return -1;
    }

    return 0;
#endif
}